

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# integrators.cpp
# Opt level: O2

string * __thiscall
pbrt::Integrator::ToString_abi_cxx11_(string *__return_storage_ptr__,Integrator *this)

{
  pointer pLVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args;
  Integrator *args_00;
  unsigned_long *in_R9;
  pointer pLVar2;
  LightHandle *l;
  string s;
  string local_90;
  string local_70;
  string local_50;
  
  args = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&this->sceneBounds;
  local_90._M_dataplus._M_p =
       (pointer)((long)(this->lights).
                       super__Vector_base<pbrt::LightHandle,_std::allocator<pbrt::LightHandle>_>.
                       _M_impl.super__Vector_impl_data._M_finish -
                 (long)(this->lights).
                       super__Vector_base<pbrt::LightHandle,_std::allocator<pbrt::LightHandle>_>.
                       _M_impl.super__Vector_impl_data._M_start >> 3);
  StringPrintf<pbrt::PrimitiveHandle_const&,pbrt::Bounds3<float>const&,unsigned_long>
            (&local_70,(pbrt *)"[ Scene aggregate: %s sceneBounds: %s lights[%d]: [ ",
             (char *)&this->aggregate,(PrimitiveHandle *)args,(Bounds3<float> *)&local_90,in_R9);
  pLVar1 = (this->lights).super__Vector_base<pbrt::LightHandle,_std::allocator<pbrt::LightHandle>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  for (pLVar2 = (this->lights).
                super__Vector_base<pbrt::LightHandle,_std::allocator<pbrt::LightHandle>_>._M_impl.
                super__Vector_impl_data._M_start; pLVar2 != pLVar1; pLVar2 = pLVar2 + 1) {
    LightHandle::ToString_abi_cxx11_(&local_50,pLVar2);
    StringPrintf<std::__cxx11::string>(&local_90,(pbrt *)"%s, ",(char *)&local_50,args);
    std::__cxx11::string::append((string *)&local_70);
    std::__cxx11::string::~string((string *)&local_90);
    std::__cxx11::string::~string((string *)&local_50);
  }
  local_50._M_dataplus._M_p =
       (pointer)((long)(this->infiniteLights).
                       super__Vector_base<pbrt::LightHandle,_std::allocator<pbrt::LightHandle>_>.
                       _M_impl.super__Vector_impl_data._M_finish -
                 (long)(this->infiniteLights).
                       super__Vector_base<pbrt::LightHandle,_std::allocator<pbrt::LightHandle>_>.
                       _M_impl.super__Vector_impl_data._M_start >> 3);
  args_00 = this;
  StringPrintf<unsigned_long>(&local_90,"] infiniteLights[%d]: [ ",(unsigned_long *)&local_50);
  std::__cxx11::string::append((string *)&local_70);
  std::__cxx11::string::~string((string *)&local_90);
  pLVar1 = (this->infiniteLights).
           super__Vector_base<pbrt::LightHandle,_std::allocator<pbrt::LightHandle>_>._M_impl.
           super__Vector_impl_data._M_finish;
  for (pLVar2 = (this->infiniteLights).
                super__Vector_base<pbrt::LightHandle,_std::allocator<pbrt::LightHandle>_>._M_impl.
                super__Vector_impl_data._M_start; pLVar2 != pLVar1; pLVar2 = pLVar2 + 1) {
    LightHandle::ToString_abi_cxx11_(&local_50,pLVar2);
    StringPrintf<std::__cxx11::string>
              (&local_90,(pbrt *)"%s, ",(char *)&local_50,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)args_00);
    std::__cxx11::string::append((string *)&local_70);
    std::__cxx11::string::~string((string *)&local_90);
    std::__cxx11::string::~string((string *)&local_50);
  }
  std::operator+(__return_storage_ptr__,&local_70," ]");
  std::__cxx11::string::~string((string *)&local_70);
  return __return_storage_ptr__;
}

Assistant:

std::string Integrator::ToString() const {
    std::string s = StringPrintf("[ Scene aggregate: %s sceneBounds: %s lights[%d]: [ ",
                                 aggregate, sceneBounds, lights.size());
    for (const auto &l : lights)
        s += StringPrintf("%s, ", l.ToString());
    s += StringPrintf("] infiniteLights[%d]: [ ", infiniteLights.size());
    for (const auto &l : infiniteLights)
        s += StringPrintf("%s, ", l.ToString());
    return s + " ]";
}